

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

ma_result ma_data_source_get_length_in_seconds(ma_data_source *pDataSource,float *pLength)

{
  ma_result mVar1;
  ma_data_source_base *pDataSourceBase;
  ma_uint64 lengthInPCMFrames;
  ma_uint32 sampleRate;
  ma_uint32 channels;
  ma_format format;
  long local_30;
  uint local_24;
  undefined1 local_20 [4];
  undefined1 local_1c [4];
  
  mVar1 = MA_INVALID_ARGS;
  if (pLength != (float *)0x0) {
    *pLength = 0.0;
    local_30 = 0;
    if (pDataSource != (ma_data_source *)0x0) {
      if (*(long *)((long)pDataSource + 0x10) == -1) {
        if (*(code **)(*pDataSource + 0x20) == (code *)0x0) {
          return MA_NOT_IMPLEMENTED;
        }
        mVar1 = (**(code **)(*pDataSource + 0x20))(pDataSource,&local_30);
        if (mVar1 != MA_SUCCESS) {
          return mVar1;
        }
      }
      else {
        local_30 = *(long *)((long)pDataSource + 0x10) - *(long *)((long)pDataSource + 8);
      }
      if (*(code **)(*pDataSource + 0x10) == (code *)0x0) {
        mVar1 = MA_NOT_IMPLEMENTED;
      }
      else {
        mVar1 = (**(code **)(*pDataSource + 0x10))(pDataSource,local_1c,local_20,&local_24,0,0);
        if (mVar1 == MA_SUCCESS) {
          *pLength = (float)local_30 / (float)local_24;
          mVar1 = MA_SUCCESS;
        }
      }
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_data_source_get_length_in_seconds(ma_data_source* pDataSource, float* pLength)
{
    ma_result result;
    ma_uint64 lengthInPCMFrames;
    ma_uint32 sampleRate;

    if (pLength == NULL) {
        return MA_INVALID_ARGS;
    }

    *pLength = 0;

    result = ma_data_source_get_length_in_pcm_frames(pDataSource, &lengthInPCMFrames);
    if (result != MA_SUCCESS) {
        return result;
    }

    result = ma_data_source_get_data_format(pDataSource, NULL, NULL, &sampleRate, NULL, 0);
    if (result != MA_SUCCESS) {
        return result;
    }

    /* VC6 does not support division of unsigned 64-bit integers with floating point numbers. Need to use a signed number. This shouldn't effect anything in practice. */
    *pLength = (ma_int64)lengthInPCMFrames / (float)sampleRate;

    return MA_SUCCESS;
}